

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteToConsoleListener.cpp
# Opt level: O0

void __thiscall
Common::WriteToConsoleListener::~WriteToConsoleListener(WriteToConsoleListener *this)

{
  char *pcVar1;
  ostream *poVar2;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> lock;
  WriteToConsoleListener *this_local;
  
  lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->_mutex);
  if (this == (WriteToConsoleListener *)0x0) {
    __cxa_bad_typeid();
  }
  pcVar1 = std::type_info::name((type_info *)(this->super_Listener)._vptr_Listener[-1]);
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar1);
  poVar2 = std::operator<<(poVar2,"::");
  poVar2 = std::operator<<(poVar2,"~WriteToConsoleListener");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  Listener::~Listener(&this->super_Listener);
  return;
}

Assistant:

WriteToConsoleListener::~WriteToConsoleListener()
{
    auto lock = std::lock_guard(_mutex);
    std::cout << typeid(*this).name() << "::" << __func__ << std::endl;
}